

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O0

void __thiscall i2p::sam::Session::Disconnect(Session *this)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  long in_FS_OFFSET;
  ConstevalFormatString<0U> in_stack_00000028;
  size_t in_stack_00000030;
  undefined1 in_stack_00000040 [16];
  Level in_stack_00000120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000130;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff90;
  LogFlags in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (bVar2) {
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (bVar2) {
      bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                  Trace);
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_RDI,in_stack_ffffffffffffff90);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_RDI,in_stack_ffffffffffffff90);
        in_stack_ffffffffffffff78 = 2;
        source_file._M_str = (char *)this;
        source_file._M_len = in_stack_00000030;
        LogPrintFormatInternal<>
                  ((string_view)in_stack_00000040,source_file,in_stack_ffffffffffffffec,
                   in_stack_ffffffffffffffe0,in_stack_00000120,in_stack_00000028);
      }
    }
    else {
      bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                  Trace);
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_RDI,in_stack_ffffffffffffff90);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_RDI,in_stack_ffffffffffffff90);
        in_stack_ffffffffffffff78 = 2;
        source_file_00._M_str = (char *)this;
        source_file_00._M_len = in_stack_00000030;
        LogPrintFormatInternal<std::__cxx11::string>
                  ((string_view)in_stack_00000040,source_file_00,in_stack_ffffffffffffffec,
                   in_stack_ffffffffffffffe0,in_stack_00000120,
                   (ConstevalFormatString<1U>)in_stack_00000028.fmt,in_stack_00000130);
      }
    }
    std::unique_ptr<Sock,_std::default_delete<Sock>_>::reset
              ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),(pointer)0xf65320);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Session::Disconnect()
{
    if (m_control_sock) {
        if (m_session_id.empty()) {
            LogPrintLevel(BCLog::I2P, BCLog::Level::Info, "Destroying incomplete SAM session\n");
        } else {
            LogPrintLevel(BCLog::I2P, BCLog::Level::Info, "Destroying SAM session %s\n", m_session_id);
        }
        m_control_sock.reset();
    }
    m_session_id.clear();
}